

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.cpp
# Opt level: O0

void __thiscall
MovParsedSRTTrackData::extractData(MovParsedSRTTrackData *this,AVPacket *pkt,uint8_t *buff,int size)

{
  byte *pbVar1;
  byte *pbVar2;
  uint8_t uVar3;
  byte bVar4;
  bool bVar5;
  int64_t iVar6;
  void *pvVar7;
  size_t sVar8;
  long lVar9;
  ulong uVar10;
  byte *pbVar11;
  iterator iVar12;
  iterator iVar13;
  reference ppVar14;
  type *ptVar15;
  uint8_t *puVar16;
  type *snd;
  type *fst;
  __normal_iterator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_220;
  iterator __end2;
  iterator __begin2;
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range2;
  pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e8;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c0;
  __normal_iterator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_198;
  const_iterator local_190;
  ushort local_184;
  ushort local_182;
  uint16_t endChar;
  ulong uStack_180;
  uint16_t startChar;
  size_t i_1;
  int local_170;
  uint uStack_16c;
  uint16_t entry_count;
  int i;
  uint32_t modifierType;
  int64_t modifierLen;
  string local_158 [36];
  uint local_134;
  uint8_t *puStack_130;
  uint32_t unitSize;
  uint8_t *dst;
  string local_108;
  string local_e8;
  long local_c8;
  int64_t endTime;
  int64_t startTime;
  undefined1 local_a8 [8];
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  tags;
  string subtitleText;
  string suffix;
  string prefix;
  uint8_t *end;
  byte *pbStack_20;
  int size_local;
  uint8_t *buff_local;
  AVPacket *pkt_local;
  MovParsedSRTTrackData *this_local;
  
  std::__cxx11::string::string((string *)(suffix.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(subtitleText.field_2._M_local_buf + 8));
  std::__cxx11::string::string
            ((string *)
             &tags.
              super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)local_a8);
  if (this->m_packetCnt == 0) {
    std::__cxx11::string::operator=
              ((string *)(suffix.field_2._M_local_buf + 8),anon_var_dwarf_f633c);
  }
  lVar9 = this->m_timeOffset;
  endTime = lVar9;
  iVar6 = getSttsVal(this);
  local_c8 = lVar9 + iVar6;
  this->m_packetCnt = this->m_packetCnt + 1;
  int32ToStr_abi_cxx11_(&local_e8,&this->m_packetCnt);
  std::__cxx11::string::operator+=((string *)(suffix.field_2._M_local_buf + 8),(string *)&local_e8);
  std::__cxx11::string::~string((string *)&local_e8);
  std::__cxx11::string::operator+=((string *)(suffix.field_2._M_local_buf + 8),"\n");
  floatToTime_abi_cxx11_(&local_108,(double)endTime / 1000.0,',');
  std::__cxx11::string::operator+=((string *)(suffix.field_2._M_local_buf + 8),(string *)&local_108)
  ;
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::operator+=((string *)(suffix.field_2._M_local_buf + 8)," --> ");
  floatToTime_abi_cxx11_((string *)&dst,(double)local_c8 / 1000.0,',');
  std::__cxx11::string::operator+=((string *)(suffix.field_2._M_local_buf + 8),(string *)&dst);
  std::__cxx11::string::~string((string *)&dst);
  std::__cxx11::string::operator+=((string *)(suffix.field_2._M_local_buf + 8),'\n');
  puVar16 = pkt->data;
  puStack_130 = puVar16;
  pvVar7 = (void *)std::__cxx11::string::c_str();
  sVar8 = std::__cxx11::string::length();
  memcpy(puVar16,pvVar7,sVar8);
  lVar9 = std::__cxx11::string::length();
  puStack_130 = puStack_130 + lVar9;
  local_134 = 0;
  pbStack_20 = buff;
  while (local_134 == 0) {
    uVar3 = *pbStack_20;
    puVar16 = pbStack_20 + 1;
    pbStack_20 = pbStack_20 + 2;
    local_134 = (uint)CONCAT11(uVar3,*puVar16);
  }
  uVar10 = (ulong)local_134;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_158,(char *)pbStack_20,uVar10,(allocator *)((long)&modifierLen + 7));
  std::__cxx11::string::operator=
            ((string *)
             &tags.
              super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,local_158);
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)((long)&modifierLen + 7));
  pbStack_20 = pbStack_20 + local_134;
  while (pbStack_20 < buff + size) {
    bVar4 = *pbStack_20;
    pbVar11 = pbStack_20 + 1;
    pbVar1 = pbStack_20 + 2;
    pbVar2 = pbStack_20 + 3;
    uStack_16c = (uint)pbStack_20[4] << 0x18 | (uint)pbStack_20[5] << 0x10 |
                 (uint)pbStack_20[6] << 8 | (uint)pbStack_20[7];
    pbStack_20 = pbStack_20 + 8;
    _i = (long)(int)((uint)bVar4 << 0x18 | (uint)*pbVar11 << 0x10 | (uint)*pbVar1 << 8 |
                    (uint)*pbVar2) + -8;
    if (_i == 1) {
      _i = 0;
      for (local_170 = 0; local_170 < 8; local_170 = local_170 + 1) {
        _i = (ulong)*pbStack_20 | _i << 8;
        pbStack_20 = pbStack_20 + 1;
      }
      _i = _i - 8;
    }
    if (uStack_16c == 0x7374796c) {
      i_1._6_2_ = CONCAT11(*pbStack_20,pbStack_20[1]);
      pbStack_20 = pbStack_20 + 2;
      for (uStack_180 = 0; uStack_180 < i_1._6_2_; uStack_180 = uStack_180 + 1) {
        std::__cxx11::string::operator=((string *)(suffix.field_2._M_local_buf + 8),"");
        std::__cxx11::string::operator=((string *)(subtitleText.field_2._M_local_buf + 8),"");
        local_182 = CONCAT11(*pbStack_20,pbStack_20[1]);
        local_184 = CONCAT11(pbStack_20[2],pbStack_20[3]);
        pbVar11 = pbStack_20 + 6;
        if (local_182 < local_184) {
          if ((*pbVar11 & 1) != 0) {
            std::__cxx11::string::operator+=((string *)(suffix.field_2._M_local_buf + 8),"<b>");
            std::__cxx11::string::insert((ulong)((long)&subtitleText.field_2 + 8),(char *)0x0);
          }
          if ((*pbVar11 & 2) != 0) {
            std::__cxx11::string::operator+=((string *)(suffix.field_2._M_local_buf + 8),"<i>");
            std::__cxx11::string::insert((ulong)((long)&subtitleText.field_2 + 8),(char *)0x0);
          }
          if ((*pbVar11 & 4) != 0) {
            std::__cxx11::string::operator+=((string *)(suffix.field_2._M_local_buf + 8),"<u>");
            std::__cxx11::string::insert((ulong)((long)&subtitleText.field_2 + 8),(char *)0x0);
          }
          local_198._M_current =
               (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)std::
                  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::begin((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_a8);
          __gnu_cxx::
          __normal_iterator<std::pair<int,std::__cxx11::string>const*,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>
          ::__normal_iterator<std::pair<int,std::__cxx11::string>*>
                    ((__normal_iterator<std::pair<int,std::__cxx11::string>const*,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>
                      *)&local_190,&local_198);
          std::make_pair<unsigned_short&,std::__cxx11::string&>
                    (&local_1e8,&local_182,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&suffix.field_2 + 8));
          std::
          pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::
          pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
                    (&local_1c0,&local_1e8);
          std::
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::insert((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_a8,local_190,&local_1c0);
          std::
          pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair(&local_1c0);
          std::
          pair<unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~pair(&local_1e8);
          std::
          vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
          ::emplace_back<unsigned_short&,std::__cxx11::string&>
                    ((vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>
                      *)local_a8,&local_184,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&subtitleText.field_2 + 8));
        }
        pbStack_20 = pbStack_20 + 0xc;
      }
    }
    else {
      pbStack_20 = pbStack_20 + _i;
    }
  }
  bVar5 = std::
          vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::empty((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_a8);
  if (!bVar5) {
    iVar12 = std::
             vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_a8);
    iVar13 = std::
             vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::end((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)local_a8);
    std::
    sort<__gnu_cxx::__normal_iterator<std::pair<int,std::__cxx11::string>*,std::vector<std::pair<int,std::__cxx11::string>,std::allocator<std::pair<int,std::__cxx11::string>>>>,std::greater<void>>
              (iVar12._M_current,iVar13._M_current);
    __end2 = std::
             vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_a8);
    local_220._M_current =
         (pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)std::
            vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::end((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_a8);
    while (bVar5 = __gnu_cxx::operator!=(&__end2,&local_220), bVar5) {
      ppVar14 = __gnu_cxx::
                __normal_iterator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                ::operator*(&__end2);
      std::
      pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)&fst,ppVar14);
      ptVar15 = std::get<0ul,int,std::__cxx11::string>
                          ((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)&fst);
      std::get<1ul,int,std::__cxx11::string>
                ((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&fst);
      std::__cxx11::string::insert
                ((ulong)&tags.
                         super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,(string *)(long)*ptVar15
                );
      std::
      pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~pair((pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)&fst);
      __gnu_cxx::
      __normal_iterator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_*,_std::vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  puVar16 = puStack_130;
  pvVar7 = (void *)std::__cxx11::string::c_str();
  sVar8 = std::__cxx11::string::length();
  memcpy(puVar16,pvVar7,sVar8);
  lVar9 = std::__cxx11::string::length();
  puVar16 = puStack_130 + lVar9;
  puStack_130 = puVar16 + 1;
  *puVar16 = '\n';
  *puStack_130 = '\n';
  this->m_timeOffset = local_c8;
  std::
  vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_a8);
  std::__cxx11::string::~string
            ((string *)
             &tags.
              super__Vector_base<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)(subtitleText.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(suffix.field_2._M_local_buf + 8));
  return;
}

Assistant:

void extractData(AVPacket* pkt, uint8_t* buff, int size) override
    {
        uint8_t* end = buff + size;
        std::string prefix;
        std::string suffix;
        std::string subtitleText;
        std::vector<pair<int, string>> tags;
        if (m_packetCnt == 0)
            prefix = "\xEF\xBB\xBF";  // UTF-8 header
        int64_t startTime = m_timeOffset;
        int64_t endTime = startTime + getSttsVal();
        prefix += int32ToStr(++m_packetCnt);
        prefix += "\n";
        prefix += floatToTime(static_cast<double>(startTime) / 1e3, ',');
        prefix += " --> ";
        prefix += floatToTime(static_cast<double>(endTime) / 1e3, ',');
        prefix += '\n';
        uint8_t* dst = pkt->data;
        memcpy(dst, prefix.c_str(), prefix.length());
        dst += prefix.length();
        uint32_t unitSize = 0;

        while (unitSize == 0)
        {
            unitSize = (buff[0] << 8) | buff[1];
            buff += 2;
        }
        subtitleText = std::string(reinterpret_cast<char*>(buff), unitSize);
        buff += unitSize;

        while (buff < end)
        {
            int64_t modifierLen = (buff[0] << 24) | (buff[1] << 16) | (buff[2] << 8) | buff[3];
            uint32_t modifierType = (buff[4] << 24) | (buff[5] << 16) | (buff[6] << 8) | buff[7];
            buff += 8;
            modifierLen -= 8;
            if (modifierLen == 1)  // 64-bit length
            {
                modifierLen = 0;
                for (int i = 0; i < 8; i++)
                {
                    modifierLen <<= 8;
                    modifierLen |= *buff++;
                }
                modifierLen -= 8;
            }
            if (modifierType == 0x7374796C)  // 'styl' box
            {
                auto entry_count = static_cast<uint16_t>(buff[0] << 8 | buff[1]);
                buff += 2;
                for (size_t i = 0; i < entry_count; i++)
                {
                    prefix = "";
                    suffix = "";
                    auto startChar = static_cast<uint16_t>(buff[0] << 8 | buff[1]);
                    auto endChar = static_cast<uint16_t>(buff[2] << 8 | buff[3]);
                    buff += 6;  // startChar, endChar, font_ID
                    if (startChar < endChar)
                    {
                        if (*buff & 1)
                        {
                            prefix += "<b>";
                            suffix.insert(0, "</b>");
                        }
                        if (*buff & 2)
                        {
                            prefix += "<i>";
                            suffix.insert(0, "</i>");
                        }
                        if (*buff & 4)
                        {
                            prefix += "<u>";
                            suffix.insert(0, "</u>");
                        }
                        tags.insert(tags.begin(), std::make_pair(startChar, prefix));
                        tags.emplace_back(endChar, suffix);
                    }
                    buff += 6;  // font-size, text-color-rgba[4]
                }
            }
            else
                buff += modifierLen;
        }
        if (!tags.empty())
        {
            sort(tags.begin(), tags.end(), greater<>());
            for (auto [fst, snd] : tags) subtitleText.insert(fst, snd);
        }
        memcpy(dst, subtitleText.c_str(), subtitleText.length());
        dst += subtitleText.length();
        *dst++ = '\n';
        *dst = '\n';
        m_timeOffset = endTime;
    }